

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

QList<QSimplexConstraint_*> * __thiscall
QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints
          (QList<QSimplexConstraint_*> *__return_storage_ptr__,QGraphicsAnchorLayoutPrivate *this,
          QList<QtGraphicsAnchorLayout::AnchorData_*> *anchors)

{
  double dVar1;
  AnchorData *pAVar2;
  AnchorData *pAVar3;
  qreal *pqVar4;
  QSimplexConstraint *pQVar5;
  bool bVar6;
  AnchorVertex *second;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  qreal qVar12;
  double dVar13;
  double dVar14;
  qreal qVar15;
  QSimplexVariable *copy;
  double local_48;
  QSimplexConstraint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anchors->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_005c2078;
  }
  uVar8 = (byte)(*(anchors->d).ptr)->field_0x78 >> 4 & 1;
  second = (this->layoutCentralVertex).m_data[uVar8];
  if (second == (AnchorVertex *)0x0) {
    second = (this->layoutLastVertex).m_data[uVar8];
  }
  pAVar3 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     ((this->graph).m_data + uVar8,(this->layoutFirstVertex).m_data[uVar8],second);
  if (pAVar3->from == (this->layoutFirstVertex).m_data[uVar8]) {
    qVar12 = pAVar3->maxSize;
  }
  else {
    qVar12 = -pAVar3->minSize;
  }
  if (qVar12 != *(double *)
                 (&DAT_006f0f80 +
                 (ulong)((this->layoutCentralVertex).m_data[uVar8] == (AnchorVertex *)0x0) * 8)) {
    pAVar3 = (AnchorData *)0x0;
  }
  if (NAN(qVar12) ||
      NAN(*(double *)
           (&DAT_006f0f80 +
           (ulong)((this->layoutCentralVertex).m_data[uVar8] == (AnchorVertex *)0x0) * 8))) {
    pAVar3 = (AnchorData *)0x0;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((anchors->d).size == 0) {
LAB_005c1fcb:
    pQVar5 = (QSimplexConstraint *)operator_new(0x30);
    (pQVar5->variables).d = (Data *)0x0;
    pQVar5->constant = 0.0;
    pQVar5->ratio = Equal;
    (pQVar5->helper).first = (QConcreteSimplexVariable *)0x0;
    (pQVar5->helper).second = 0.0;
    pQVar5->artificial = (QConcreteSimplexVariable *)0x0;
    local_40 = (QSimplexConstraint *)&pAVar3->super_QSimplexVariable;
    if (pAVar3 == (AnchorData *)0x0) {
      local_40 = (QSimplexConstraint *)0x0;
    }
    local_48 = 1.0;
    QHash<QSimplexVariable*,double>::emplace<double_const&>
              ((QHash<QSimplexVariable*,double> *)pQVar5,(QSimplexVariable **)&local_40,&local_48);
    pQVar5->constant = 16777215.0;
    pQVar5->ratio = LessOrEqual;
    local_40 = pQVar5;
    QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
              ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_40);
    QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
  }
  else {
    bVar6 = true;
    uVar7 = 0;
    do {
      pAVar2 = (anchors->d).ptr[uVar7];
      if ((pAVar2->field_0x78 & 0x60) != 0x40) {
        dVar1 = pAVar2->minSize;
        if ((16777215.0 < dVar1) || (qVar12 = -16777215.0, -16777215.0 < dVar1)) {
          pqVar4 = (qreal *)&g_offset;
          if (dVar1 <= 16777215.0) {
            pqVar4 = &pAVar2->minSize;
          }
          qVar12 = *pqVar4;
        }
        dVar1 = pAVar2->maxSize;
        if ((16777215.0 < dVar1) || (qVar15 = -16777215.0, -16777215.0 < dVar1)) {
          pqVar4 = (qreal *)&g_offset;
          if (dVar1 <= 16777215.0) {
            pqVar4 = &pAVar2->maxSize;
          }
          qVar15 = *pqVar4;
        }
        if ((qVar12 != qVar15) || (NAN(qVar12) || NAN(qVar15))) {
          dVar1 = qVar12 - qVar15;
          uVar9 = -(ulong)(dVar1 < -dVar1);
          uVar10 = -(ulong)(qVar12 < -qVar12);
          uVar11 = -(ulong)(qVar15 < -qVar15);
          dVar13 = (double)(~uVar10 & (ulong)qVar12 | (ulong)-qVar12 & uVar10);
          dVar14 = (double)(~uVar11 & (ulong)qVar15 | (ulong)-qVar15 & uVar11);
          if (dVar14 <= dVar13) {
            dVar13 = dVar14;
          }
          if (dVar13 < (double)(~uVar9 & (ulong)dVar1 | (ulong)-dVar1 & uVar9) * 1000000000000.0) {
            pQVar5 = (QSimplexConstraint *)operator_new(0x30);
            (pQVar5->variables).d = (Data *)0x0;
            pQVar5->constant = 0.0;
            pQVar5->ratio = Equal;
            (pQVar5->helper).first = (QConcreteSimplexVariable *)0x0;
            (pQVar5->helper).second = 0.0;
            pQVar5->artificial = (QConcreteSimplexVariable *)0x0;
            local_48 = 1.0;
            local_40 = (QSimplexConstraint *)&pAVar2->super_QSimplexVariable;
            QHash<QSimplexVariable*,double>::emplace<double_const&>
                      ((QHash<QSimplexVariable*,double> *)pQVar5,(QSimplexVariable **)&local_40,
                       &local_48);
            pQVar5->constant = qVar12;
            pQVar5->ratio = MoreOrEqual;
            local_40 = pQVar5;
            QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
                      ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_40);
            QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
            if (pAVar2 != pAVar3) {
              pQVar5 = (QSimplexConstraint *)operator_new(0x30);
              (pQVar5->variables).d = (Data *)0x0;
              pQVar5->constant = 0.0;
              pQVar5->ratio = Equal;
              (pQVar5->helper).first = (QConcreteSimplexVariable *)0x0;
              (pQVar5->helper).second = 0.0;
              pQVar5->artificial = (QConcreteSimplexVariable *)0x0;
              local_48 = 1.0;
              local_40 = (QSimplexConstraint *)&pAVar2->super_QSimplexVariable;
              QHash<QSimplexVariable*,double>::emplace<double_const&>
                        ((QHash<QSimplexVariable*,double> *)pQVar5,(QSimplexVariable **)&local_40,
                         &local_48);
              pQVar5->constant = qVar15;
              pQVar5->ratio = LessOrEqual;
              local_40 = pQVar5;
              QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
                        ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,&local_40);
              QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
              bVar6 = false;
            }
            goto LAB_005c1fb0;
          }
        }
        pQVar5 = (QSimplexConstraint *)operator_new(0x30);
        (pQVar5->variables).d = (Data *)0x0;
        pQVar5->constant = 0.0;
        pQVar5->ratio = Equal;
        (pQVar5->helper).first = (QConcreteSimplexVariable *)0x0;
        (pQVar5->helper).second = 0.0;
        pQVar5->artificial = (QConcreteSimplexVariable *)0x0;
        local_40 = (QSimplexConstraint *)&pAVar2->super_QSimplexVariable;
        local_48 = 1.0;
        QHash<QSimplexVariable*,double>::emplace<double_const&>
                  ((QHash<QSimplexVariable*,double> *)pQVar5,(QSimplexVariable **)&local_40,
                   &local_48);
        pQVar5->constant = qVar12;
        pQVar5->ratio = Equal;
        local_40 = pQVar5;
        QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
                  ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_40);
        QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
        bVar6 = false;
      }
LAB_005c1fb0:
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(anchors->d).size);
    if (bVar6) goto LAB_005c1fcb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005c2078:
  __stack_chk_fail();
}

Assistant:

QList<QSimplexConstraint *> QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints(
    const QList<AnchorData *> &anchors)
{
    if (anchors.isEmpty())
        return QList<QSimplexConstraint *>();

    // Look for the layout edge. That can be either the first half in case the
    // layout is split in two, or the whole layout anchor.
    const Qt::Orientation orient = anchors.first()->isVertical ? Qt::Vertical : Qt::Horizontal;
    AnchorData *layoutEdge = nullptr;
    if (layoutCentralVertex[orient]) {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutCentralVertex[orient]);
    } else {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutLastVertex[orient]);
    }

    // If maxSize is less then "infinite", that means there are other anchors
    // grouped together with this one. We can't ignore its maximum value so we
    // set back the variable to NULL to prevent the continue condition from being
    // satisfied in the loop below.
    const qreal expectedMax = layoutCentralVertex[orient] ? QWIDGETSIZE_MAX / 2 : QWIDGETSIZE_MAX;
    qreal actualMax;
    if (layoutEdge->from == layoutFirstVertex[orient]) {
        actualMax = layoutEdge->maxSize;
    } else {
        actualMax = -layoutEdge->minSize;
    }
    if (actualMax != expectedMax) {
        layoutEdge = nullptr;
    }

    // For each variable, create constraints based on size hints
    QList<QSimplexConstraint *> anchorConstraints;
    bool unboundedProblem = true;
    for (int i = 0; i < anchors.size(); ++i) {
        AnchorData *ad = anchors.at(i);

        // Anchors that have their size directly linked to another one don't need constraints
        // For exammple, the second half of an item has exactly the same size as the first half
        // thus constraining the latter is enough.
        if (ad->dependency == AnchorData::Slave)
            continue;

        // To use negative variables inside simplex, we shift them so the minimum negative value is
        // mapped to zero before solving. To make sure that it works, we need to guarantee that the
        // variables are all inside a certain boundary.
        qreal boundedMin = qBound(-g_offset, ad->minSize, g_offset);
        qreal boundedMax = qBound(-g_offset, ad->maxSize, g_offset);

        if ((boundedMin == boundedMax) || qFuzzyCompare(boundedMin, boundedMax)) {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::Equal;
            anchorConstraints += c;
            unboundedProblem = false;
        } else {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::MoreOrEqual;
            anchorConstraints += c;

            // We avoid adding restrictions to the layout internal anchors. That's
            // to prevent unnecessary fair distribution from happening due to this
            // artificial restriction.
            if (ad == layoutEdge)
                continue;

            c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMax;
            c->ratio = QSimplexConstraint::LessOrEqual;
            anchorConstraints += c;
            unboundedProblem = false;
        }
    }

    // If no upper boundary restriction was added, add one to avoid unbounded problem
    if (unboundedProblem) {
        QSimplexConstraint *c = new QSimplexConstraint;
        c->variables.insert(layoutEdge, 1.0);
        // The maximum size that the layout can take
        c->constant = g_offset;
        c->ratio = QSimplexConstraint::LessOrEqual;
        anchorConstraints += c;
    }

    return anchorConstraints;
}